

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

void __thiscall ON_RTree::RemoveAllRec(ON_RTree *this,ON_RTreeNode *a_node)

{
  Blk *blk;
  long lVar1;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar2;
  
  if ((0 < a_node->m_level) && (0 < a_node->m_count)) {
    paVar2 = &a_node->m_branch[0].field_1;
    lVar1 = 0;
    do {
      RemoveAllRec(this,paVar2->m_child);
      lVar1 = lVar1 + 1;
      paVar2 = paVar2 + 7;
    } while (lVar1 < a_node->m_count);
  }
  *(Blk **)a_node = (this->m_mem_pool).m_nodes;
  (this->m_mem_pool).m_nodes = (Blk *)a_node;
  return;
}

Assistant:

void ON_RTree::RemoveAllRec(ON_RTreeNode* a_node)
{
  if(a_node->IsInternalNode()) // This is an internal node in the tree
  {
    for(int index=0; index < a_node->m_count; ++index)
    {
      RemoveAllRec(a_node->m_branch[index].m_child);
    }
  }
  m_mem_pool.FreeNode(a_node); 
}